

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# avg_intrin_sse2.c
# Opt level: O2

void aom_int_pro_col_sse2
               (int16_t *vbuf,uint8_t *ref,int ref_stride,int width,int height,int norm_factor)

{
  long lVar1;
  ulong uVar2;
  ulong uVar3;
  short sVar4;
  short sVar5;
  short sVar6;
  short sVar7;
  undefined1 auVar8 [16];
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)height;
  if (height < 1) {
    uVar2 = uVar3;
  }
  for (; uVar3 != uVar2; uVar3 = uVar3 + 1) {
    sVar4 = 0;
    sVar5 = 0;
    sVar6 = 0;
    sVar7 = 0;
    for (lVar1 = 0; (int)lVar1 < width; lVar1 = lVar1 + 0x10) {
      auVar8 = psadbw(*(undefined1 (*) [16])(ref + lVar1),(undefined1  [16])0x0);
      sVar4 = sVar4 + auVar8._0_2_;
      sVar5 = sVar5 + auVar8._2_2_;
      sVar6 = sVar6 + auVar8._8_2_;
      sVar7 = sVar7 + auVar8._10_2_;
    }
    vbuf[uVar3] = (int16_t)(CONCAT22(sVar7 + sVar5,sVar6 + sVar4) >> ((byte)norm_factor & 0x1f));
    ref = ref + ref_stride;
  }
  return;
}

Assistant:

void aom_int_pro_col_sse2(int16_t *vbuf, const uint8_t *ref,
                          const int ref_stride, const int width,
                          const int height, int norm_factor) {
  // SIMD implementation assumes width to be multiple of 16.
  assert(width % 16 == 0);

  for (int ht = 0; ht < height; ht++) {
    const uint8_t *ref_tmp = ref + (ht * ref_stride);
    __m128i zero = _mm_setzero_si128();
    __m128i s0 = zero;
    __m128i s1, src_line;
    for (int i = 0; i < width; i += 16) {
      src_line = _mm_loadu_si128((const __m128i *)ref_tmp);
      s1 = _mm_sad_epu8(src_line, zero);
      s0 = _mm_add_epi16(s0, s1);
      ref_tmp += 16;
    }

    s1 = _mm_srli_si128(s0, 8);
    s0 = _mm_add_epi16(s0, s1);
    vbuf[ht] = _mm_cvtsi128_si32(s0) >> norm_factor;
  }
}